

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmetaobject.cpp
# Opt level: O0

QMetaMethod QMetaObjectPrivate::firstMethod(QMetaObject *baseObject,QByteArrayView name)

{
  bool bVar1;
  QMetaObjectPrivate *pQVar2;
  QMetaMethod *in_RDI;
  long in_FS_OFFSET;
  int i;
  int end;
  int start;
  QMetaObject *currentObject;
  QMetaMethod candidate;
  QByteArrayView *in_stack_ffffffffffffff78;
  QByteArrayView *in_stack_ffffffffffffff80;
  undefined4 in_stack_ffffffffffffff88;
  int in_stack_ffffffffffffff8c;
  uint in_stack_ffffffffffffff90;
  int iVar3;
  QMetaMethod *local_60;
  QMetaMethod local_18;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_60 = in_RDI;
  while (local_60 != (QMetaMethod *)0x0) {
    pQVar2 = priv((uint *)local_60[1].mobj);
    iVar3 = pQVar2->methodCount;
    while (iVar3 = iVar3 + -1, -1 < iVar3) {
      local_18.data.d = (uint *)&DAT_aaaaaaaaaaaaaaaa;
      local_18.mobj = (QMetaObject *)&DAT_aaaaaaaaaaaaaaaa;
      local_18 = QMetaMethod::fromRelativeMethodIndex
                           ((QMetaObject *)CONCAT44(iVar3,in_stack_ffffffffffffff90),
                            in_stack_ffffffffffffff8c);
      QMetaMethod::name(in_RDI);
      QByteArrayView::QByteArrayView<QByteArray,_true>
                ((QByteArrayView *)CONCAT44(iVar3,in_stack_ffffffffffffff90),
                 (QByteArray *)CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88));
      bVar1 = ::operator==(in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
      in_stack_ffffffffffffff90 = CONCAT13(bVar1,(int3)in_stack_ffffffffffffff90);
      QByteArray::~QByteArray((QByteArray *)0x35e28f);
      if ((in_stack_ffffffffffffff90 & 0x1000000) != 0) goto LAB_0035e2cd;
    }
    local_60 = (QMetaMethod *)QMetaObject::superClass((QMetaObject *)0x35e2b9);
  }
  QMetaMethod::QMetaMethod(&local_18);
LAB_0035e2cd:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return local_18;
}

Assistant:

QMetaMethod QMetaObjectPrivate::firstMethod(const QMetaObject *baseObject, QByteArrayView name)
{
    for (const QMetaObject *currentObject = baseObject; currentObject; currentObject = currentObject->superClass()) {
        const int start = priv(currentObject->d.data)->methodCount - 1;
        const int end = 0;
        for (int i = start; i >= end; --i) {
            auto candidate = QMetaMethod::fromRelativeMethodIndex(currentObject, i);
            if (name == candidate.name())
                return candidate;
        }
    }
    return QMetaMethod{};
}